

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O3

MoveData * __thiscall
Rml::ElementHandleTargetData::GetMoveData
          (MoveData *__return_storage_ptr__,ElementHandleTargetData *this,Vector2f *drag_delta_min,
          Vector2f *drag_delta_max)

{
  undefined8 uVar1;
  Vector2f VVar2;
  Vector2f VVar3;
  CommonValues CVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  fVar7 = GetPositionLeft(this);
  fVar8 = GetPositionTop(this);
  (__return_storage_ptr__->original_position_top_left).x = fVar7;
  (__return_storage_ptr__->original_position_top_left).y = fVar8;
  fVar7 = GetPositionRight(this);
  fVar8 = GetPositionBottom(this);
  (__return_storage_ptr__->original_position_bottom_right).x = fVar7;
  (__return_storage_ptr__->original_position_bottom_right).y = fVar8;
  CVar4 = this->computed->common;
  bVar5 = ((undefined1  [96])CVar4 & (undefined1  [96])0x3000000000) == (undefined1  [96])0x0;
  (__return_storage_ptr__->bottom_right).x = !bVar5;
  bVar6 = ((undefined1  [96])CVar4 & (undefined1  [96])0xc000000000) == (undefined1  [96])0x0;
  (__return_storage_ptr__->bottom_right).y = !bVar6;
  (__return_storage_ptr__->top_left).x =
       ((undefined1  [96])CVar4 & (undefined1  [96])0x30000000000) != (undefined1  [96])0x0 || bVar5
  ;
  (__return_storage_ptr__->top_left).y =
       ((undefined1  [96])CVar4 & (undefined1  [96])0xc00000000) != (undefined1  [96])0x0 || bVar6;
  VVar2 = DistanceToTopLeft(this);
  VVar3 = DistanceToBottomRight(this,VVar2);
  local_38 = VVar2.x;
  fStack_34 = VVar2.y;
  VVar2.y = (this->resolved_edge_margin)._M_elems[0] - fStack_34;
  VVar2.x = (this->resolved_edge_margin)._M_elems[3] - local_38;
  VVar2 = Math::Max<Rml::Vector2<float>>(*drag_delta_min,VVar2);
  *drag_delta_min = VVar2;
  uVar1 = *(undefined8 *)((this->resolved_edge_margin)._M_elems + 1);
  local_48 = VVar3.x;
  fStack_44 = VVar3.y;
  VVar3.y = fStack_44 - (float)((ulong)uVar1 >> 0x20);
  VVar3.x = local_48 - (float)uVar1;
  VVar2 = Math::Min<Rml::Vector2<float>>(*drag_delta_max,VVar3);
  *drag_delta_max = VVar2;
  return __return_storage_ptr__;
}

Assistant:

MoveData GetMoveData(Vector2f& drag_delta_min, Vector2f& drag_delta_max) const
	{
		using namespace Style;
		MoveData data = {};

		data.original_position_top_left = {GetPositionLeft(), GetPositionTop()};
		data.original_position_bottom_right = {GetPositionRight(), GetPositionBottom()};

		data.bottom_right.x = (computed.right().type != Right::Auto);
		data.bottom_right.y = (computed.bottom().type != Bottom::Auto);
		data.top_left.x = (!data.bottom_right.x || computed.left().type != Left::Auto);
		data.top_left.y = (!data.bottom_right.y || computed.top().type != Top::Auto);

		const Vector2f distance_to_top_left = DistanceToTopLeft();
		const Vector2f distance_to_bottom_right = DistanceToBottomRight(distance_to_top_left);

		drag_delta_min = Math::Max(drag_delta_min, Vector2f{resolved_edge_margin[LEFT], resolved_edge_margin[TOP]} - distance_to_top_left);
		drag_delta_max = Math::Min(drag_delta_max, Vector2f{-resolved_edge_margin[RIGHT], -resolved_edge_margin[BOTTOM]} + distance_to_bottom_right);

		return data;
	}